

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_utl.cc
# Opt level: O0

int X509_check_ip_asc(X509 *x,char *ipasc,uint flags)

{
  int iVar1;
  size_t iplen;
  uchar ipout [16];
  uint flags_local;
  char *ipasc_local;
  X509 *x_local;
  
  if (ipasc == (char *)0x0) {
    x_local._4_4_ = -2;
  }
  else {
    ipout._12_4_ = flags;
    iVar1 = x509v3_a2i_ipadd((uint8_t *)&iplen,ipasc);
    if ((long)iVar1 == 0) {
      x_local._4_4_ = -2;
    }
    else {
      x_local._4_4_ = do_x509_check(x,(char *)&iplen,(long)iVar1,ipout._12_4_,7,(char **)0x0);
    }
  }
  return x_local._4_4_;
}

Assistant:

int X509_check_ip_asc(const X509 *x, const char *ipasc, unsigned int flags) {
  unsigned char ipout[16];
  size_t iplen;

  if (ipasc == NULL) {
    return -2;
  }
  iplen = (size_t)x509v3_a2i_ipadd(ipout, ipasc);
  if (iplen == 0) {
    return -2;
  }
  return do_x509_check(x, (const char *)ipout, iplen, flags, GEN_IPADD, NULL);
}